

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

int nn_ipc_optset_setopt(nn_optset *self,int option,void *optval,size_t optvallen)

{
  nn_optset *local_38;
  nn_ipc_optset *optset;
  size_t optvallen_local;
  void *optval_local;
  int option_local;
  nn_optset *self_local;
  int local_4;
  
  local_38 = self;
  if (self == (nn_optset *)0x0) {
    local_38 = (nn_optset *)0x0;
  }
  if (optvallen < 4) {
    local_4 = -0x16;
  }
  else if (option == 1) {
    local_38[1].vfptr = (nn_optset_vfptr *)optval;
    local_4 = 0;
  }
  else if (option == 2) {
    *(undefined4 *)&local_38[2].vfptr = *optval;
    local_4 = 0;
  }
  else if (option == 3) {
    *(undefined4 *)((long)&local_38[2].vfptr + 4) = *optval;
    local_4 = 0;
  }
  else {
    local_4 = -0x5c;
  }
  return local_4;
}

Assistant:

static int nn_ipc_optset_setopt (struct nn_optset *self, int option,
    const void *optval, size_t optvallen)
{
    struct nn_ipc_optset *optset;

    optset = nn_cont (self, struct nn_ipc_optset, base);
    if (optvallen < sizeof (int)) {
        return -EINVAL;
    }

    switch (option) {
    case NN_IPC_SEC_ATTR: 
        optset->sec_attr = (void *)optval;
        return 0;
    case NN_IPC_OUTBUFSZ:
        optset->outbuffersz = *(int *)optval;
        return 0;
    case NN_IPC_INBUFSZ:
        optset->inbuffersz = *(int *)optval;
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}